

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_format_gnutar_header(archive_write *a,char *h,archive_entry *entry,int tartype)

{
  void *pvVar1;
  mode_t mVar2;
  int iVar3;
  size_t sVar4;
  la_int64_t lVar5;
  time_t v;
  dev_t dVar6;
  gnutar *gnutar;
  char *p;
  size_t copy_length;
  int ret;
  int i;
  uint checksum;
  int tartype_local;
  archive_entry *entry_local;
  char *h_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  copy_length._0_4_ = 0;
  memcpy(h,"",0x200);
  if ((tartype == 0x4b) || (tartype == 0x4c)) {
    gnutar = (gnutar *)archive_entry_pathname(entry);
    p = (char *)strlen((char *)gnutar);
  }
  else {
    gnutar = *(gnutar **)((long)pvVar1 + 0x20);
    p = *(char **)((long)pvVar1 + 0x28);
  }
  if ((char *)0x64 < p) {
    p = (char *)0x64;
  }
  memcpy(h,gnutar,(size_t)p);
  p = *(char **)((long)pvVar1 + 0x18);
  if (p != (char *)0x0) {
    if ((char *)0x64 < p) {
      p = (char *)0x64;
    }
    memcpy(h + 0x9d,*(void **)((long)pvVar1 + 0x10),(size_t)p);
  }
  if ((tartype == 0x4b) || (tartype == 0x4c)) {
    gnutar = (gnutar *)archive_entry_uname(entry);
    p = (char *)strlen((char *)gnutar);
  }
  else {
    gnutar = *(gnutar **)((long)pvVar1 + 0x30);
    p = *(char **)((long)pvVar1 + 0x38);
  }
  if (p != (char *)0x0) {
    if ((char *)0x20 < p) {
      p = (char *)0x20;
    }
    memcpy(h + 0x109,gnutar,(size_t)p);
  }
  if ((tartype == 0x4b) || (tartype == 0x4c)) {
    gnutar = (gnutar *)archive_entry_gname(entry);
    p = (char *)strlen((char *)gnutar);
  }
  else {
    gnutar = *(gnutar **)((long)pvVar1 + 0x40);
    p = *(char **)((long)pvVar1 + 0x48);
  }
  if (p != (char *)0x0) {
    sVar4 = strlen((char *)gnutar);
    if (0x20 < sVar4) {
      p = (char *)0x20;
    }
    memcpy(h + 0x129,gnutar,(size_t)p);
  }
  mVar2 = archive_entry_mode(entry);
  format_octal((ulong)(mVar2 & 0xfff),h + 100,7);
  lVar5 = archive_entry_uid(entry);
  iVar3 = format_number(lVar5,h + 0x6c,7,8);
  if (iVar3 != 0) {
    lVar5 = archive_entry_uid(entry);
    archive_set_error(&a->archive,0x22,"Numeric user ID %jd too large",lVar5);
    copy_length._0_4_ = -0x19;
  }
  lVar5 = archive_entry_gid(entry);
  iVar3 = format_number(lVar5,h + 0x74,7,8);
  if (iVar3 != 0) {
    lVar5 = archive_entry_gid(entry);
    archive_set_error(&a->archive,0x22,"Numeric group ID %jd too large",lVar5);
    copy_length._0_4_ = -0x19;
  }
  lVar5 = archive_entry_size(entry);
  iVar3 = format_number(lVar5,h + 0x7c,0xb,0xc);
  if (iVar3 != 0) {
    archive_set_error(&a->archive,0x22,"File size out of range");
    copy_length._0_4_ = -0x19;
  }
  v = archive_entry_mtime(entry);
  format_octal(v,h + 0x88,0xb);
  mVar2 = archive_entry_filetype(entry);
  if ((mVar2 == 0x6000) || (mVar2 = archive_entry_filetype(entry), mVar2 == 0x2000)) {
    dVar6 = archive_entry_rdevmajor(entry);
    iVar3 = format_octal(dVar6,h + 0x149,6);
    if (iVar3 != 0) {
      archive_set_error(&a->archive,0x22,"Major device number too large");
      copy_length._0_4_ = -0x19;
    }
    dVar6 = archive_entry_rdevminor(entry);
    iVar3 = format_octal(dVar6,h + 0x151,6);
    if (iVar3 != 0) {
      archive_set_error(&a->archive,0x22,"Minor device number too large");
      copy_length._0_4_ = -0x19;
    }
  }
  h[0x9c] = (char)tartype;
  ret = 0;
  for (copy_length._4_4_ = 0; copy_length._4_4_ < 0x200; copy_length._4_4_ = copy_length._4_4_ + 1)
  {
    ret = (uint)(byte)h[copy_length._4_4_] + ret;
  }
  h[0x9a] = '\0';
  format_octal((ulong)(uint)ret,h + 0x94,6);
  return (int)copy_length;
}

Assistant:

static int
archive_format_gnutar_header(struct archive_write *a, char h[512],
    struct archive_entry *entry, int tartype)
{
	unsigned int checksum;
	int i, ret;
	size_t copy_length;
	const char *p;
	struct gnutar *gnutar;

	gnutar = (struct gnutar *)a->format_data;

	ret = 0;

	/*
	 * The "template header" already includes the signature,
	 * various end-of-field markers, and other required elements.
	 */
	memcpy(h, &template_header, 512);

	/*
	 * Because the block is already null-filled, and strings
	 * are allowed to exactly fill their destination (without null),
	 * I use memcpy(dest, src, strlen()) here a lot to copy strings.
	 */

	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_pathname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->pathname;
		copy_length = gnutar->pathname_length;
	}
	if (copy_length > GNUTAR_name_size)
		copy_length = GNUTAR_name_size;
	memcpy(h + GNUTAR_name_offset, p, copy_length);

	if ((copy_length = gnutar->linkname_length) > 0) {
		if (copy_length > GNUTAR_linkname_size)
			copy_length = GNUTAR_linkname_size;
		memcpy(h + GNUTAR_linkname_offset, gnutar->linkname,
		    copy_length);
	}

	/* TODO: How does GNU tar handle unames longer than GNUTAR_uname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_uname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->uname;
		copy_length = gnutar->uname_length;
	}
	if (copy_length > 0) {
		if (copy_length > GNUTAR_uname_size)
			copy_length = GNUTAR_uname_size;
		memcpy(h + GNUTAR_uname_offset, p, copy_length);
	}

	/* TODO: How does GNU tar handle gnames longer than GNUTAR_gname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_gname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->gname;
		copy_length = gnutar->gname_length;
	}
	if (copy_length > 0) {
		if (strlen(p) > GNUTAR_gname_size)
			copy_length = GNUTAR_gname_size;
		memcpy(h + GNUTAR_gname_offset, p, copy_length);
	}

	/* By truncating the mode here, we ensure it always fits. */
	format_octal(archive_entry_mode(entry) & 07777,
	    h + GNUTAR_mode_offset, GNUTAR_mode_size);

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_uid(entry), h + GNUTAR_uid_offset,
		GNUTAR_uid_size, GNUTAR_uid_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID %jd too large",
		    (intmax_t)archive_entry_uid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_gid(entry), h + GNUTAR_gid_offset,
		GNUTAR_gid_size, GNUTAR_gid_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID %jd too large",
		    (intmax_t)archive_entry_gid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_size(entry), h + GNUTAR_size_offset,
		GNUTAR_size_size, GNUTAR_size_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		ret = ARCHIVE_FAILED;
	}

	/* Shouldn't overflow before 2106, since mtime field is 33 bits. */
	format_octal(archive_entry_mtime(entry),
	    h + GNUTAR_mtime_offset, GNUTAR_mtime_size);

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
		if (format_octal(archive_entry_rdevmajor(entry),
		    h + GNUTAR_rdevmajor_offset,
			GNUTAR_rdevmajor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Major device number too large");
			ret = ARCHIVE_FAILED;
		}

		if (format_octal(archive_entry_rdevminor(entry),
		    h + GNUTAR_rdevminor_offset,
			GNUTAR_rdevminor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Minor device number too large");
			ret = ARCHIVE_FAILED;
		}
	}

	h[GNUTAR_typeflag_offset] = tartype;

	checksum = 0;
	for (i = 0; i < 512; i++)
		checksum += 255 & (unsigned int)h[i];
	h[GNUTAR_checksum_offset + 6] = '\0'; /* Can't be pre-set in the template. */
	/* h[GNUTAR_checksum_offset + 7] = ' '; */ /* This is pre-set in the template. */
	format_octal(checksum, h + GNUTAR_checksum_offset, 6);
	return (ret);
}